

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall BanMan::SweepBanned(BanMan *this)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  int64_t iVar4;
  reference ppVar5;
  _Self _Var6;
  iterator flag;
  long in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  bool notify_ui;
  int64_t now;
  CBanEntry ban_entry;
  iterator it;
  CSubNet sub_net;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  CSubNet *in_stack_fffffffffffffec8;
  _Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  undefined7 in_stack_ffffffffffffff08;
  int source_line;
  ConstevalFormatString<1U> in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  CSubNet local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
             (AnnotatedMixin<std::mutex> *)0xf13709);
  iVar4 = GetTime();
  bVar1 = false;
  std::
  map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
  ::begin((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
           *)in_stack_fffffffffffffec0);
  while( true ) {
    std::
    map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
    ::end((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
           *)in_stack_fffffffffffffec0);
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffec8,(_Self *)in_stack_fffffffffffffec0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    CSubNet::CSubNet(in_stack_fffffffffffffec8,(CSubNet *)in_stack_fffffffffffffec0);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    pcVar9 = (char *)(ppVar5->second).nBanUntil;
    pcVar7 = *(char **)&ppVar5->second;
    sVar8 = (ppVar5->second).nCreateTime;
    uVar3 = CSubNet::IsValid((CSubNet *)
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (((bool)uVar3) && (iVar4 <= (long)pcVar9)) {
      std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> *)
                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    else {
      _Var6 = std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>::operator++
                        (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      source_line = (int)((ulong)_Var6._M_node >> 0x20);
      flag = std::
             map<CSubNet,CBanEntry,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
             ::erase_abi_cxx11_((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                                 *)in_stack_fffffffffffffec0,in_stack_fffffffffffffed8);
      *(undefined1 *)(in_RDI + 0x58) = 1;
      bVar1 = true;
      bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                                  Trace);
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffffed8._M_node,(char *)in_stack_fffffffffffffed0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffffed8._M_node,(char *)in_stack_fffffffffffffed0);
        CSubNet::ToString_abi_cxx11_((CSubNet *)CONCAT17(uVar3,in_stack_ffffffffffffff08));
        in_stack_fffffffffffffec8 = &local_60;
        in_stack_fffffffffffffec0 = "Removed banned node address/subnet: %s\n";
        in_stack_fffffffffffffeb8 = 1;
        logging_function._M_str = pcVar9;
        logging_function._M_len = sVar8;
        source_file._M_str = pcVar7;
        source_file._M_len = in_stack_ffffffffffffff70;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,source_line,(LogFlags)flag._M_node,in_stack_00000060
                   ,in_stack_ffffffffffffff68,in_stack_00000070);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      }
    }
    CSubNet::~CSubNet((CSubNet *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  if ((bVar1) && (*(long *)(in_RDI + 0x60) != 0)) {
    CClientUIInterface::BannedListChanged
              ((CClientUIInterface *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BanMan::SweepBanned()
{
    AssertLockHeld(m_banned_mutex);

    int64_t now = GetTime();
    bool notify_ui = false;
    banmap_t::iterator it = m_banned.begin();
    while (it != m_banned.end()) {
        CSubNet sub_net = (*it).first;
        CBanEntry ban_entry = (*it).second;
        if (!sub_net.IsValid() || now > ban_entry.nBanUntil) {
            m_banned.erase(it++);
            m_is_dirty = true;
            notify_ui = true;
            LogDebug(BCLog::NET, "Removed banned node address/subnet: %s\n", sub_net.ToString());
        } else {
            ++it;
        }
    }

    // update UI
    if (notify_ui && m_client_interface) {
        m_client_interface->BannedListChanged();
    }
}